

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall qpdf::BaseHandle::write_json(BaseHandle *this,int json_version,Writer *p)

{
  _Rb_tree_node_base *name;
  _Rb_tree_color _Var1;
  element_type *peVar2;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var3;
  _Base_ptr p_Var4;
  _Base_ptr this_00;
  BaseHandle *pBVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar6;
  _Rb_tree_header *p_Var7;
  uint uVar8;
  __index_type _Var9;
  pair<bool,_bool> pVar10;
  int iVar11;
  shared_ptr<QPDFObject> *psVar12;
  variant_alternative_t<10UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar13;
  variant_alternative_t<5UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar14;
  string *name_00;
  variant_alternative_t<9UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar15;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar16;
  _Rb_tree_node_base *p_Var17;
  variant_alternative_t<3UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar18;
  _func_int *UNRECOVERED_JUMPTABLE;
  variant_alternative_t<4UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar19;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar20;
  Writer *pWVar21;
  _Base_ptr p_Var22;
  variant_alternative_t<6UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *this_02;
  _func_int **pp_Var23;
  logic_error *this_03;
  ulong uVar24;
  ulong uVar25;
  size_type sVar26;
  char *pcVar27;
  undefined8 uVar28;
  QPDFObjGen QVar29;
  Pipeline *pPVar30;
  uint __len;
  int iVar31;
  int j;
  ulong __val;
  QPDFObjectHandle *item;
  BaseHandle *this_04;
  QPDFObjGen item_og;
  string local_80;
  string local_60;
  int local_3c;
  variant_alternative_t<8UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *local_38;
  
  peVar2 = (this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = (int)(char)(peVar2->value).
                        super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        .
                        super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                        ._M_index;
    if (iVar11 == 0xd) {
      psVar12 = QPDF::resolve(peVar2->qpdf,peVar2->og);
      iVar11 = (int)(char)(((psVar12->super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->value).
                          super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          .
                          super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                          ._M_index;
    }
  }
  switch(iVar11) {
  case 0:
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_03,"QPDFObjectHandle: attempting to get JSON from a uninitialized object");
    break;
  default:
    this_03 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_03,"attempted to write an unsuitable object as JSON");
    break;
  case 2:
  case 0xb:
  case 0xc:
    pPVar30 = p->p;
    UNRECOVERED_JUMPTABLE = pPVar30->_vptr_Pipeline[2];
    pcVar27 = "null";
    uVar25 = 4;
    goto LAB_001c2db0;
  case 3:
    pvVar18 = std::
              get<3ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    pcVar27 = "false";
    if ((ulong)pvVar18->val != 0) {
      pcVar27 = "true";
    }
    uVar25 = (ulong)pvVar18->val ^ 5;
    pPVar30 = p->p;
    UNRECOVERED_JUMPTABLE = pPVar30->_vptr_Pipeline[2];
LAB_001c2db0:
    (*UNRECOVERED_JUMPTABLE)(pPVar30,pcVar27,uVar25);
    return;
  case 4:
    pvVar19 = std::
              get<4ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    uVar25 = pvVar19->val;
    __val = -uVar25;
    if (0 < (long)uVar25) {
      __val = uVar25;
    }
    __len = 1;
    if (9 < __val) {
      uVar24 = __val;
      uVar8 = 4;
      do {
        __len = uVar8;
        if (uVar24 < 100) {
          __len = __len - 2;
          goto LAB_001c3356;
        }
        if (uVar24 < 1000) {
          __len = __len - 1;
          goto LAB_001c3356;
        }
        if (uVar24 < 10000) goto LAB_001c3356;
        bVar6 = 99999 < uVar24;
        uVar24 = uVar24 / 10000;
        uVar8 = __len + 4;
      } while (bVar6);
      __len = __len + 1;
    }
LAB_001c3356:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,(char)__len - (char)((long)uVar25 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_80._M_dataplus._M_p - ((long)uVar25 >> 0x3f)),__len,__val);
    (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
    local_60.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_60._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
    goto LAB_001c33ab;
  case 5:
    pvVar14 = std::
              get<5ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    sVar26 = (pvVar14->val)._M_string_length;
    if (sVar26 == 0) {
      pPVar30 = p->p;
      pp_Var23 = pPVar30->_vptr_Pipeline;
      pcVar27 = "0";
      sVar26 = 1;
    }
    else {
      pcVar27 = (pvVar14->val)._M_dataplus._M_p;
      if (*pcVar27 == '.') {
        (*p->p->_vptr_Pipeline[2])(p->p,"0",1);
        pcVar27 = (pvVar14->val)._M_dataplus._M_p;
        sVar26 = (pvVar14->val)._M_string_length;
      }
      else if ((*pcVar27 == '-' && sVar26 != 1) && (pcVar27[1] == '.')) {
        (*p->p->_vptr_Pipeline[2])(p->p,"-0.",3);
        std::__cxx11::string::substr((ulong)&local_80,(ulong)pvVar14);
        (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001c3241;
      }
      pPVar30 = p->p;
      pp_Var23 = pPVar30->_vptr_Pipeline;
    }
    (*pp_Var23[2])(pPVar30,pcVar27,sVar26);
LAB_001c3241:
    if ((pvVar14->val)._M_dataplus._M_p[(pvVar14->val)._M_string_length - 1] != '.') {
      return;
    }
    (*p->p->_vptr_Pipeline[2])(p->p,"0",1);
    return;
  case 6:
    this_02 = std::
              get<6ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    QPDF_String::writeJSON(this_02,json_version,p);
    return;
  case 7:
    name_00 = &std::
               get<7ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->value)->name;
    if (json_version == 1) {
      (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
      Name::normalize(&local_60,name_00);
      JSON::Writer::encode_string(&local_80,&local_60);
      (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
      (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
    }
    else {
      pVar10 = Name::analyzeJSONEncoding(name_00);
      if (((ushort)pVar10 & 1) != 0) {
        (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
        if (((ushort)pVar10 >> 8 & 1) != 0) {
          (*p->p->_vptr_Pipeline[2])(p->p,(name_00->_M_dataplus)._M_p,name_00->_M_string_length);
          pPVar30 = p->p;
          UNRECOVERED_JUMPTABLE = pPVar30->_vptr_Pipeline[2];
          pcVar27 = "\"";
          uVar25 = 1;
          goto LAB_001c2db0;
        }
        JSON::Writer::encode_string(&local_80,name_00);
        (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
        (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
        goto LAB_001c3025;
      }
      (*p->p->_vptr_Pipeline[2])(p->p,"\"n:",3);
      Name::normalize(&local_60,name_00);
      JSON::Writer::encode_string(&local_80,&local_60);
      (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
      (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
    goto LAB_001c33ab;
  case 8:
    local_3c = json_version;
    pvVar20 = std::
              get<8ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    local_80._M_dataplus._M_p._0_1_ = 0x5b;
    (*p->p->_vptr_Pipeline[2])(p->p,&local_80,1);
    p->first = true;
    p->indent = p->indent + 2;
    _Var3._M_head_impl =
         (pvVar20->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var3._M_head_impl == (Sparse *)0x0) {
      this_04 = &((pvVar20->elements).
                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_BaseHandle;
      pBVar5 = &((pvVar20->elements).
                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_BaseHandle;
      if (this_04 != pBVar5) {
        do {
          JSON::Writer::writeNext(p);
          peVar2 = (this_04->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (this_04->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_60._M_dataplus._M_p = *(pointer *)&peVar2->og;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
            local_60._M_dataplus._M_p = *(pointer *)&peVar2->og;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
          }
          if ((int)local_60._M_dataplus._M_p == 0) {
            write_json(this_04,local_3c,p);
          }
          else {
            (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
            QPDFObjGen::unparse_abi_cxx11_(&local_80,(QPDFObjGen *)&local_60,' ');
            (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
            (*p->p->_vptr_Pipeline[2])(p->p," R\"",3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          this_04 = this_04 + 1;
        } while (this_04 != pBVar5);
      }
    }
    else {
      p_Var22 = ((_Var3._M_head_impl)->elements)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      p_Var7 = &((_Var3._M_head_impl)->elements)._M_t._M_impl.super__Rb_tree_header;
      local_38 = pvVar20;
      if ((_Rb_tree_header *)p_Var22 == p_Var7) {
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        do {
          _Var1 = p_Var22[1]._M_color;
          iVar31 = _Var1 - iVar11;
          if (iVar31 != 0 && iVar11 <= (int)_Var1) {
            do {
              pWVar21 = JSON::Writer::writeNext(p);
              (*pWVar21->p->_vptr_Pipeline[2])(pWVar21->p,"null",4);
              iVar31 = iVar31 + -1;
            } while (iVar31 != 0);
          }
          JSON::Writer::writeNext(p);
          p_Var4 = p_Var22[1]._M_parent;
          this_00 = p_Var22[1]._M_left;
          if (this_00 == (_Base_ptr)0x0) {
            local_60._M_dataplus._M_p = (pointer)p_Var4[2]._M_left;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&this_00->_M_parent = *(int *)&this_00->_M_parent + 1;
            }
            local_60._M_dataplus._M_p = (pointer)p_Var4[2]._M_left;
            if (this_00 != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
            }
          }
          if ((int)local_60._M_dataplus._M_p == 0) {
            write_json((BaseHandle *)&p_Var22[1]._M_parent,local_3c,p);
          }
          else {
            (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
            QPDFObjGen::unparse_abi_cxx11_(&local_80,(QPDFObjGen *)&local_60,' ');
            (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
            (*p->p->_vptr_Pipeline[2])(p->p," R\"",3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          iVar11 = _Var1 + _S_black;
          p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22);
        } while ((_Rb_tree_header *)p_Var22 != p_Var7);
      }
      pvVar20 = local_38;
      if (iVar11 < ((local_38->sp)._M_t.
                    super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                    .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->size) {
        do {
          pWVar21 = JSON::Writer::writeNext(p);
          (*pWVar21->p->_vptr_Pipeline[2])(pWVar21->p,"null",4);
          iVar11 = iVar11 + 1;
        } while (iVar11 < ((pvVar20->sp)._M_t.
                           super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                           .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->size);
      }
    }
    local_80._M_dataplus._M_p._0_1_ = 0x5d;
    goto LAB_001c3343;
  case 9:
    pvVar15 = std::
              get<9ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    local_80._M_dataplus._M_p._0_1_ = 0x7b;
    (*p->p->_vptr_Pipeline[2])(p->p,&local_80,1);
    p->first = true;
    p->indent = p->indent + 2;
    for (p_Var17 = (pvVar15->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var17 != &(pvVar15->items)._M_t._M_impl.super__Rb_tree_header;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
              **)(p_Var17 + 2);
      if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  *)0x0) {
        _Var9 = (__v->
                super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                ).
                super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                .
                super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                ._M_index;
        if (_Var9 == '\x0f') {
          pvVar16 = std::
                    get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                              (__v);
LAB_001c2b9e:
          _Var9 = (((pvVar16->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->value).
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  ._M_index;
        }
        else if (_Var9 == '\r') {
          pvVar16 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                     *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                     *(QPDFObjGen *)
                                      ((long)&__v[1].
                                              super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                              .
                                              super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                              .
                                              super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                              .
                                              super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                              .
                                              super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                              .
                                              super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                              ._M_u + 0x18));
          goto LAB_001c2b9e;
        }
        if (_Var9 != '\x02') {
          name = p_Var17 + 1;
          JSON::Writer::writeNext(p);
          if (json_version == 1) {
            (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
            Name::normalize(&local_60,(string *)name);
            JSON::Writer::encode_string(&local_80,&local_60);
            (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
            (*p->p->_vptr_Pipeline[2])(p->p,"\": ",3);
LAB_001c2cf9:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            uVar28 = local_60.field_2._M_allocated_capacity;
            QVar29 = (QPDFObjGen)local_60._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
LAB_001c2d29:
              operator_delete((void *)QVar29,uVar28 + 1);
            }
          }
          else {
            pVar10 = Name::analyzeJSONEncoding((string *)name);
            if (((ushort)pVar10 & 1) == 0) {
              (*p->p->_vptr_Pipeline[2])(p->p,"\"n:",3);
              Name::normalize(&local_60,(string *)name);
              JSON::Writer::encode_string(&local_80,&local_60);
              (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
              (*p->p->_vptr_Pipeline[2])(p->p,"\": ",3);
              goto LAB_001c2cf9;
            }
            (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
            if (((ushort)pVar10 >> 8 & 1) == 0) {
              JSON::Writer::encode_string(&local_80,(string *)name);
              (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
              (*p->p->_vptr_Pipeline[2])(p->p,"\": ",3);
              uVar28 = local_80.field_2._M_allocated_capacity;
              QVar29 = (QPDFObjGen)local_80._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_001c2d31;
              goto LAB_001c2d29;
            }
            (*p->p->_vptr_Pipeline[2])(p->p,*(undefined8 *)(p_Var17 + 1),p_Var17[1]._M_parent);
            (*p->p->_vptr_Pipeline[2])(p->p,"\": ",3);
          }
LAB_001c2d31:
          QPDFObjectHandle::writeJSON((QPDFObjectHandle *)(p_Var17 + 2),json_version,p,false);
        }
      }
    }
    local_80._M_dataplus._M_p._0_1_ = 0x7d;
LAB_001c3343:
    JSON::Writer::writeEnd(p,(char *)&local_80);
    return;
  case 10:
    pvVar13 = std::
              get<10ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                        (&((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->value);
    QPDFObjectHandle::writeJSON
              (&((pvVar13->m)._M_t.
                 super___uniq_ptr_impl<QPDF_Stream::Members,_std::default_delete<QPDF_Stream::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDF_Stream::Members_*,_std::default_delete<QPDF_Stream::Members>_>
                 .super__Head_base<0UL,_QPDF_Stream::Members_*,_false>._M_head_impl)->stream_dict,
               json_version,p,false);
    return;
  case 0xf:
    (*p->p->_vptr_Pipeline[2])(p->p,"\"",1);
    QPDFObjGen::unparse_abi_cxx11_
              (&local_80,
               &((this->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og,
               ' ');
    (*p->p->_vptr_Pipeline[2])(p->p,local_80._M_dataplus._M_p,local_80._M_string_length);
    (*p->p->_vptr_Pipeline[2])(p->p," R\"",3);
LAB_001c3025:
    local_60.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    local_60._M_dataplus._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
LAB_001c33ab:
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    return;
  }
  __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
BaseHandle::write_json(int json_version, JSON::Writer& p) const
{
    switch (resolved_type_code()) {
    case ::ot_uninitialized:
        throw std::logic_error(
            "QPDFObjectHandle: attempting to get JSON from a uninitialized object");
        break; // unreachable
    case ::ot_null:
    case ::ot_operator:
    case ::ot_inlineimage:
        p << "null";
        break;
    case ::ot_boolean:
        p << std::get<QPDF_Bool>(obj->value).val;
        break;
    case ::ot_integer:
        p << std::to_string(std::get<QPDF_Integer>(obj->value).val);
        break;
    case ::ot_real:
        {
            auto const& val = std::get<QPDF_Real>(obj->value).val;
            if (val.length() == 0) {
                // Can't really happen...
                p << "0";
            } else if (val.at(0) == '.') {
                p << "0" << val;
            } else if (val.length() >= 2 && val.at(0) == '-' && val.at(1) == '.') {
                p << "-0." << val.substr(2);
            } else {
                p << val;
            }
            if (val.back() == '.') {
                p << "0";
            }
        }
        break;
    case ::ot_string:
        std::get<QPDF_String>(obj->value).writeJSON(json_version, p);
        break;
    case ::ot_name:
        {
            auto const& n = std::get<QPDF_Name>(obj->value);
            // For performance reasons this code is duplicated in QPDF_Dictionary::writeJSON. When
            // updating this method make sure QPDF_Dictionary is also update.
            if (json_version == 1) {
                p << "\"" << JSON::Writer::encode_string(Name::normalize(n.name)) << "\"";
            } else {
                if (auto res = Name::analyzeJSONEncoding(n.name); res.first) {
                    if (res.second) {
                        p << "\"" << n.name << "\"";
                    } else {
                        p << "\"" << JSON::Writer::encode_string(n.name) << "\"";
                    }
                } else {
                    p << "\"n:" << JSON::Writer::encode_string(Name::normalize(n.name)) << "\"";
                }
            }
        }
        break;
    case ::ot_array:
        {
            auto const& a = std::get<QPDF_Array>(obj->value);
            p.writeStart('[');
            if (a.sp) {
                int next = 0;
                for (auto& item: a.sp->elements) {
                    int key = item.first;
                    for (int j = next; j < key; ++j) {
                        p.writeNext() << "null";
                    }
                    p.writeNext();
                    auto item_og = item.second.getObj()->getObjGen();
                    if (item_og.isIndirect()) {
                        p << "\"" << item_og.unparse(' ') << " R\"";
                    } else {
                        item.second.write_json(json_version, p);
                    }
                    next = ++key;
                }
                for (int j = next; j < a.sp->size; ++j) {
                    p.writeNext() << "null";
                }
            } else {
                for (auto const& item: a.elements) {
                    p.writeNext();
                    auto item_og = item.getObj()->getObjGen();
                    if (item_og.isIndirect()) {
                        p << "\"" << item_og.unparse(' ') << " R\"";
                    } else {
                        item.write_json(json_version, p);
                    }
                }
            }
            p.writeEnd(']');
        }
        break;
    case ::ot_dictionary:
        {
            auto const& d = std::get<QPDF_Dictionary>(obj->value);
            p.writeStart('{');
            for (auto& iter: d.items) {
                if (!iter.second.null()) {
                    p.writeNext();
                    if (json_version == 1) {
                        p << "\"" << JSON::Writer::encode_string(Name::normalize(iter.first))
                          << "\": ";
                    } else if (auto res = Name::analyzeJSONEncoding(iter.first); res.first) {
                        if (res.second) {
                            p << "\"" << iter.first << "\": ";
                        } else {
                            p << "\"" << JSON::Writer::encode_string(iter.first) << "\": ";
                        }
                    } else {
                        p << "\"n:" << JSON::Writer::encode_string(Name::normalize(iter.first))
                          << "\": ";
                    }
                    iter.second.writeJSON(json_version, p);
                }
            }
            p.writeEnd('}');
        }
        break;
    case ::ot_stream:
        std::get<QPDF_Stream>(obj->value).m->stream_dict.writeJSON(json_version, p);
        break;
    case ::ot_reference:
        p << "\"" << obj->og.unparse(' ') << " R\"";
        break;
    default:
        throw std::logic_error("attempted to write an unsuitable object as JSON");
    }
}